

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_35bf99::PpuTest_nmi_is_triggered_when_it_should_Test::
~PpuTest_nmi_is_triggered_when_it_should_Test(PpuTest_nmi_is_triggered_when_it_should_Test *this)

{
  PpuTest::~PpuTest(&this->super_PpuTest);
  operator_delete(this,0x138);
  return;
}

Assistant:

TEST_F(PpuTest, nmi_is_triggered_when_it_should) {
    bool triggered = false;
    registers.ctrl = expected.ctrl = PpuCtrl(0b1000'0000u);
    ppu->set_nmi_handler([&] { triggered = true; });

    // Nmi shouldn't get triggered before the start of vblanking.
    step_execution(kCyclesPerScanline * 241 + 1);
    ASSERT_FALSE(triggered);
    EXPECT_EQ(241, ppu->scanline());
    EXPECT_EQ(1, ppu->cycle());

    step_execution(1);
    ASSERT_TRUE(triggered);
    EXPECT_EQ(241, ppu->scanline());
    EXPECT_EQ(2, ppu->cycle());

    // Nmi should only be triggered on scanline 241.
    triggered = false;
    step_execution(kCyclesPerScanline);
    ASSERT_FALSE(triggered);
    EXPECT_EQ(242, ppu->scanline());
    EXPECT_EQ(2, ppu->cycle());
}